

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

mmt_fd_type demmt_get_fdtype(int fd)

{
  mmt_fd_type mVar1;
  
  if ((0xffff < (uint)fd) || (mVar1 = open_files[(uint)fd].type, open_files[(uint)fd].type == FDUNK)
     ) {
    mVar1 = undetected_fdtype;
  }
  return mVar1;
}

Assistant:

enum mmt_fd_type demmt_get_fdtype(int fd)
{
	enum mmt_fd_type fdtype = FDUNK;

	if (fd >= 0 && fd < MAX_FD)
		fdtype = open_files[fd].type;

	if (fdtype != FDUNK)
		return fdtype;

	return undetected_fdtype;
}